

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predicates.cxx
# Opt level: O0

double orient4d(double *pa,double *pb,double *pc,double *pd,double *pe,double aheight,double bheight
               ,double cheight,double dheight,double eheight)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double errbound;
  double permanent;
  double det;
  double dexbeyplus;
  double bexdeyplus;
  double cexaeyplus;
  double aexceyplus;
  double aexdeyplus;
  double dexaeyplus;
  double dexceyplus;
  double cexdeyplus;
  double cexbeyplus;
  double bexceyplus;
  double bexaeyplus;
  double aexbeyplus;
  double dezplus;
  double cezplus;
  double bezplus;
  double aezplus;
  double dab;
  double cda;
  double bcd;
  double abc;
  double bd;
  double ac;
  double da;
  double cd;
  double bc;
  double ab;
  double deheight;
  double ceheight;
  double beheight;
  double aeheight;
  double dexbey;
  double bexdey;
  double cexaey;
  double aexcey;
  double aexdey;
  double dexaey;
  double dexcey;
  double cexdey;
  double cexbey;
  double bexcey;
  double bexaey;
  double aexbey;
  double dez;
  double cez;
  double bez;
  double aez;
  double dey;
  double cey;
  double bey;
  double aey;
  double dex;
  double cex;
  double bex;
  double aex;
  double eheight_local;
  double dheight_local;
  double cheight_local;
  double bheight_local;
  double aheight_local;
  double *pe_local;
  double *pd_local;
  double *pc_local;
  double *pb_local;
  double *pa_local;
  
  dVar1 = *pa - *pe;
  dVar2 = *pb - *pe;
  dVar3 = *pc - *pe;
  dVar4 = *pd - *pe;
  dVar5 = pa[1] - pe[1];
  dVar6 = pb[1] - pe[1];
  dVar7 = pc[1] - pe[1];
  dVar8 = pd[1] - pe[1];
  dVar9 = pa[2] - pe[2];
  dVar10 = pb[2] - pe[2];
  dVar11 = pc[2] - pe[2];
  dVar12 = pd[2] - pe[2];
  dVar13 = dVar1 * dVar6 - dVar2 * dVar5;
  dVar14 = dVar2 * dVar7 - dVar3 * dVar6;
  dVar15 = dVar3 * dVar8 - dVar4 * dVar7;
  dVar16 = dVar4 * dVar5 - dVar1 * dVar8;
  dVar17 = dVar1 * dVar7 - dVar3 * dVar5;
  dVar18 = dVar2 * dVar8 - dVar4 * dVar6;
  pa_local = (double *)
             ((dheight - eheight) * (dVar11 * dVar13 + dVar9 * dVar14 + -(dVar10 * dVar17)) +
              -((cheight - eheight) * (dVar10 * dVar16 + dVar12 * dVar13 + dVar9 * dVar18)) +
             (bheight - eheight) * (dVar9 * dVar15 + dVar11 * dVar16 + dVar12 * dVar17) +
             -((aheight - eheight) * (dVar12 * dVar14 + dVar10 * dVar15 + -(dVar11 * dVar18))));
  dVar9 = ABS(dVar9);
  dVar10 = ABS(dVar10);
  dVar11 = ABS(dVar11);
  dVar12 = ABS(dVar12);
  dVar13 = ABS(dVar1 * dVar6);
  dVar14 = ABS(dVar2 * dVar5);
  dVar15 = ABS(dVar2 * dVar7);
  dVar16 = ABS(dVar3 * dVar6);
  dVar17 = ABS(dVar3 * dVar8);
  dVar18 = ABS(dVar4 * dVar7);
  dVar19 = ABS(dVar4 * dVar5);
  dVar20 = ABS(dVar1 * dVar8);
  dVar1 = ABS(dVar1 * dVar7);
  dVar3 = ABS(dVar3 * dVar5);
  dVar2 = ABS(dVar2 * dVar8);
  dVar4 = ABS(dVar4 * dVar6);
  dVar1 = ((dVar13 + dVar14) * dVar11 + (dVar15 + dVar16) * dVar9 + (dVar3 + dVar1) * dVar10) *
          ABS(dheight - eheight) +
          ((dVar19 + dVar20) * dVar10 + (dVar13 + dVar14) * dVar12 + (dVar2 + dVar4) * dVar9) *
          ABS(cheight - eheight) +
          ((dVar15 + dVar16) * dVar12 + (dVar17 + dVar18) * dVar10 + (dVar4 + dVar2) * dVar11) *
          ABS(aheight - eheight) +
          ((dVar17 + dVar18) * dVar9 + (dVar19 + dVar20) * dVar11 + (dVar1 + dVar3) * dVar12) *
          ABS(bheight - eheight);
  dVar2 = isperrboundA * dVar1;
  if (((double)pa_local <= dVar2) && (-(double)pa_local <= dVar2)) {
    pa_local = (double *)orient4dadapt(pa,pb,pc,pd,pe,aheight,bheight,cheight,dheight,eheight,dVar1)
    ;
  }
  return (double)pa_local;
}

Assistant:

REAL orient4d(REAL* pa, REAL* pb, REAL* pc, REAL* pd, REAL* pe, 
              REAL aheight, REAL bheight, REAL cheight, REAL dheight, 
              REAL eheight)
{
 REAL aex, bex, cex, dex;
 REAL aey, bey, cey, dey;
 REAL aez, bez, cez, dez;
 REAL aexbey, bexaey, bexcey, cexbey, cexdey, dexcey, dexaey, aexdey;
 REAL aexcey, cexaey, bexdey, dexbey;
 REAL aeheight, beheight, ceheight, deheight;
 REAL ab, bc, cd, da, ac, bd;
 REAL abc, bcd, cda, dab;
 REAL aezplus, bezplus, cezplus, dezplus;
 REAL aexbeyplus, bexaeyplus, bexceyplus, cexbeyplus;
 REAL cexdeyplus, dexceyplus, dexaeyplus, aexdeyplus;
 REAL aexceyplus, cexaeyplus, bexdeyplus, dexbeyplus;
 REAL det;
 REAL permanent, errbound;


 aex = pa[0] - pe[0];
 bex = pb[0] - pe[0];
 cex = pc[0] - pe[0];
 dex = pd[0] - pe[0];
 aey = pa[1] - pe[1];
 bey = pb[1] - pe[1];
 cey = pc[1] - pe[1];
 dey = pd[1] - pe[1];
 aez = pa[2] - pe[2];
 bez = pb[2] - pe[2];
 cez = pc[2] - pe[2];
 dez = pd[2] - pe[2];
 aeheight = aheight - eheight;
 beheight = bheight - eheight;
 ceheight = cheight - eheight;
 deheight = dheight - eheight;

 aexbey = aex * bey;
 bexaey = bex * aey;
 ab = aexbey - bexaey;
 bexcey = bex * cey;
 cexbey = cex * bey;
 bc = bexcey - cexbey;
 cexdey = cex * dey;
 dexcey = dex * cey;
 cd = cexdey - dexcey;
 dexaey = dex * aey;
 aexdey = aex * dey;
 da = dexaey - aexdey;

 aexcey = aex * cey;
 cexaey = cex * aey;
 ac = aexcey - cexaey;
 bexdey = bex * dey;
 dexbey = dex * bey;
 bd = bexdey - dexbey;

 abc = aez * bc - bez * ac + cez * ab;
 bcd = bez * cd - cez * bd + dez * bc;
 cda = cez * da + dez * ac + aez * cd;
 dab = dez * ab + aez * bd + bez * da;

 det = (deheight * abc - ceheight * dab) + (beheight * cda - aeheight * bcd);

 aezplus = Absolute(aez);
 bezplus = Absolute(bez);
 cezplus = Absolute(cez);
 dezplus = Absolute(dez);
 aexbeyplus = Absolute(aexbey);
 bexaeyplus = Absolute(bexaey);
 bexceyplus = Absolute(bexcey);
 cexbeyplus = Absolute(cexbey);
 cexdeyplus = Absolute(cexdey);
 dexceyplus = Absolute(dexcey);
 dexaeyplus = Absolute(dexaey);
 aexdeyplus = Absolute(aexdey);
 aexceyplus = Absolute(aexcey);
 cexaeyplus = Absolute(cexaey);
 bexdeyplus = Absolute(bexdey);
 dexbeyplus = Absolute(dexbey);
 permanent = ((cexdeyplus + dexceyplus) * bezplus
              + (dexbeyplus + bexdeyplus) * cezplus
              + (bexceyplus + cexbeyplus) * dezplus)
           * Absolute(aeheight)
           + ((dexaeyplus + aexdeyplus) * cezplus
              + (aexceyplus + cexaeyplus) * dezplus
              + (cexdeyplus + dexceyplus) * aezplus)
           * Absolute(beheight)
           + ((aexbeyplus + bexaeyplus) * dezplus
              + (bexdeyplus + dexbeyplus) * aezplus
              + (dexaeyplus + aexdeyplus) * bezplus)
           * Absolute(ceheight)
           + ((bexceyplus + cexbeyplus) * aezplus
              + (cexaeyplus + aexceyplus) * bezplus
              + (aexbeyplus + bexaeyplus) * cezplus)
           * Absolute(deheight);
 errbound = isperrboundA * permanent;
 if ((det > errbound) || (-det > errbound)) {
   return det;
 }

 return orient4dadapt(pa, pb, pc, pd, pe,
                      aheight, bheight, cheight, dheight, eheight, permanent);
}